

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgemm.cpp
# Opt level: O1

void __thiscall
(anonymous_namespace)::tinyBLAS_Q0_AVX<block_q4_0,block_q8_0,float>::gemm<1,2>
          (tinyBLAS_Q0_AVX<block_q4_0,block_q8_0,float> *this,int64_t m0,int64_t m,int64_t n0,
          int64_t n)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined4 *puVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  __m256 Cv [2] [1];
  float local_c0 [36];
  
  lVar8 = (n - n0) / 2;
  lVar14 = (m - m0) * lVar8;
  lVar9 = (lVar14 + -1 + (long)*(int *)(this + 0x3c)) / (long)*(int *)(this + 0x3c);
  lVar13 = *(int *)(this + 0x38) * lVar9;
  lVar9 = lVar9 + lVar13;
  if (lVar14 <= lVar9) {
    lVar9 = lVar14;
  }
  if (lVar13 < lVar9) {
    lVar14 = *(long *)(this + 0x18);
    lVar2 = *(long *)this;
    lVar3 = *(long *)(this + 8);
    lVar4 = *(long *)(this + 0x20);
    lVar5 = *(long *)(this + 0x28);
    lVar6 = *(long *)(this + 0x10);
    lVar7 = *(long *)(this + 0x30);
    auVar15[8] = 0xf;
    auVar15._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar15[9] = 0xf;
    auVar15[10] = 0xf;
    auVar15[0xb] = 0xf;
    auVar15[0xc] = 0xf;
    auVar15[0xd] = 0xf;
    auVar15[0xe] = 0xf;
    auVar15[0xf] = 0xf;
    auVar15[0x10] = 0xf;
    auVar15[0x11] = 0xf;
    auVar15[0x12] = 0xf;
    auVar15[0x13] = 0xf;
    auVar15[0x14] = 0xf;
    auVar15[0x15] = 0xf;
    auVar15[0x16] = 0xf;
    auVar15[0x17] = 0xf;
    auVar15[0x18] = 0xf;
    auVar15[0x19] = 0xf;
    auVar15[0x1a] = 0xf;
    auVar15[0x1b] = 0xf;
    auVar15[0x1c] = 0xf;
    auVar15[0x1d] = 0xf;
    auVar15[0x1e] = 0xf;
    auVar15[0x1f] = 0xf;
    auVar16[8] = 0xf8;
    auVar16._0_8_ = 0xf8f8f8f8f8f8f8f8;
    auVar16[9] = 0xf8;
    auVar16[10] = 0xf8;
    auVar16[0xb] = 0xf8;
    auVar16[0xc] = 0xf8;
    auVar16[0xd] = 0xf8;
    auVar16[0xe] = 0xf8;
    auVar16[0xf] = 0xf8;
    auVar16[0x10] = 0xf8;
    auVar16[0x11] = 0xf8;
    auVar16[0x12] = 0xf8;
    auVar16[0x13] = 0xf8;
    auVar16[0x14] = 0xf8;
    auVar16[0x15] = 0xf8;
    auVar16[0x16] = 0xf8;
    auVar16[0x17] = 0xf8;
    auVar16[0x18] = 0xf8;
    auVar16[0x19] = 0xf8;
    auVar16[0x1a] = 0xf8;
    auVar16[0x1b] = 0xf8;
    auVar16[0x1c] = 0xf8;
    auVar16[0x1d] = 0xf8;
    auVar16[0x1e] = 0xf8;
    auVar16[0x1f] = 0xf8;
    do {
      lVar10 = lVar13 / lVar8 + m0;
      lVar12 = n0 + (lVar13 % lVar8) * 2;
      local_c0[0] = 0.0;
      local_c0[1] = 0.0;
      local_c0[2] = 0.0;
      local_c0[3] = 0.0;
      local_c0[4] = 0.0;
      local_c0[5] = 0.0;
      local_c0[6] = 0.0;
      local_c0[7] = 0.0;
      local_c0[8] = 0.0;
      local_c0[9] = 0.0;
      local_c0[10] = 0.0;
      local_c0[0xb] = 0.0;
      local_c0[0xc] = 0.0;
      local_c0[0xd] = 0.0;
      local_c0[0xe] = 0.0;
      local_c0[0xf] = 0.0;
      if (0 < lVar14) {
        auVar1 = *(undefined1 (*) [16])(lVar2 + lVar4 * lVar10 * 0x12 + 2);
        auVar19 = vpsrlw_avx(auVar1,4);
        auVar18._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar1;
        auVar18._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar19;
        auVar15 = vpand_avx2(auVar18,auVar15);
        auVar15 = vpaddb_avx2(auVar15,auVar16);
        vpsignb_avx2(auVar15,auVar15);
        vpsignb_avx2(*(undefined1 (*) [32])(lVar5 * 0x22 * lVar12 + lVar3 + 2),auVar15);
        halt_baddata();
      }
      puVar11 = (undefined4 *)(lVar12 * lVar7 * 4 + lVar10 * 4 + lVar6);
      lVar12 = 0;
      do {
        auVar19._0_4_ =
             *(float *)((long)local_c0 + lVar12 + 0x10) + *(float *)((long)local_c0 + lVar12);
        auVar19._4_4_ =
             *(float *)((long)local_c0 + lVar12 + 0x14) + *(float *)((long)local_c0 + lVar12 + 4);
        auVar19._8_4_ =
             *(float *)((long)local_c0 + lVar12 + 0x18) + *(float *)((long)local_c0 + lVar12 + 8);
        auVar19._12_4_ =
             *(float *)((long)local_c0 + lVar12 + 0x1c) + *(float *)((long)local_c0 + lVar12 + 0xc);
        auVar1 = vshufpd_avx(auVar19,auVar19,1);
        auVar17._0_4_ = auVar19._0_4_ + auVar1._0_4_;
        auVar17._4_4_ = auVar19._4_4_ + auVar1._4_4_;
        auVar17._8_4_ = auVar19._8_4_ + auVar1._8_4_;
        auVar17._12_4_ = auVar19._12_4_ + auVar1._12_4_;
        auVar1 = vhaddps_avx(auVar17,auVar17);
        *puVar11 = auVar1._0_4_;
        lVar12 = lVar12 + 0x20;
        puVar11 = puVar11 + lVar7;
      } while (lVar12 == 0x20);
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar9);
  }
  return;
}

Assistant:

NOINLINE void gemm(int64_t m0, int64_t m, int64_t n0, int64_t n) {
        int64_t ytiles = (m - m0) / RM;
        int64_t xtiles = (n - n0) / RN;
        int64_t tiles = xtiles * ytiles;
        int64_t duty = (tiles + nth - 1) / nth;
        int64_t start = duty * ith;
        int64_t end = start + duty;
        if (end > tiles)
            end = tiles;
        for (int64_t job = start; job < end; ++job) {
            int64_t ii = m0 + job / xtiles * RM;
            int64_t jj = n0 + job % xtiles * RN;
            __m256 Cv[RN][RM] = {};
            for (int64_t l = 0; l < k; ++l)
                for (int64_t j = 0; j < RN; ++j)
                    for (int64_t i = 0; i < RM; ++i) {
#if defined(__AVX2__)
                        __m256 udTmp = updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                              load(A + lda * (ii + i) + l)),
                                             _mm256_sign_epi8(load(B + ldb * (jj + j) + l),
                                                              load(A + lda * (ii + i) + l)));
#else
                        __m128i ali0 = load0(A + lda * (ii + i) + l);
                        __m128i ali1 = load1(A + lda * (ii + i) + l);
                        __m128i blj0 = load0(B + ldb * (jj + j) + l);
                        __m128i blj1 = load1(B + ldb * (jj + j) + l);

                        __m128i sepAA0 = _mm_sign_epi8(ali0, ali0);
                        __m128i sepAA1 = _mm_sign_epi8(ali1, ali1);
                        __m128i sepBA0 = _mm_sign_epi8(blj0, ali0);
                        __m128i sepBA1 = _mm_sign_epi8(blj1, ali1);

                        // updot
                        const __m128i oneFill = _mm_set1_epi16(1);
                        __m128i mad0 = _mm_maddubs_epi16(sepAA0, sepBA0);
                        __m128i mad1 = _mm_maddubs_epi16(sepAA1, sepBA1);
                        __m256 udTmp = _mm256_cvtepi32_ps(MM256_SET_M128I(_mm_madd_epi16(oneFill, mad1), _mm_madd_epi16(oneFill, mad0)));
#endif
                        Cv[j][i] = madd(_mm256_set1_ps(unhalf(A[lda * (ii + i) + l].d) *
                                                       unhalf(B[ldb * (jj + j) + l].d)),
                                                       udTmp,
                                                       Cv[j][i]);
                    }
            for (int64_t j = 0; j < RN; ++j)
                for (int64_t i = 0; i < RM; ++i)
                    C[ldc * (jj + j) + (ii + i)] = hsum(Cv[j][i]);
        }
    }